

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O2

void __thiscall
ddd::DaTrie<true,_false,_true>::enumerate_prefix
          (DaTrie<true,_false,_true> *this,uint32_t node_pos,string *prefix,
          vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *kvs)

{
  pointer pBVar1;
  bool bVar2;
  uint32_t label;
  uint uVar3;
  uint node_pos_00;
  KvPair local_58;
  
  pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  node_pos_00 = SUB84(pBVar1[node_pos],0);
  if ((int)node_pos_00 < 0) {
    bVar2 = is_terminal_(this,node_pos);
    local_58.value = node_pos_00 & 0x7fffffff;
    if (bVar2) {
      local_58.value = node_pos_00;
    }
    std::__cxx11::string::string((string *)&local_58,(string *)prefix);
    std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::emplace_back<ddd::KvPair>(kvs,&local_58)
    ;
    std::__cxx11::string::~string((string *)&local_58);
  }
  else {
    if ((*(uint *)&pBVar1[node_pos_00 & 0x7fffffff].field_0x4 & 0x7fffffff) == node_pos) {
      enumerate_prefix(this,node_pos_00,prefix,kvs);
    }
    for (uVar3 = 1; uVar3 != 0x100; uVar3 = uVar3 + 1) {
      if ((*(uint *)&(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar3 ^ node_pos_00].field_0x4 & 0x7fffffff)
          == node_pos) {
        std::operator+(&local_58.key,prefix,(char)uVar3);
        enumerate_prefix(this,uVar3 ^ node_pos_00,&local_58.key,kvs);
        std::__cxx11::string::~string((string *)&local_58);
      }
    }
  }
  return;
}

Assistant:

void enumerate_prefix(uint32_t node_pos, const std::string& prefix,
                        std::vector<KvPair>& kvs) const {
    assert(node_pos < bc_.size());
    assert(bc_[node_pos].is_fixed());
    assert(Prefix);

    if (bc_[node_pos].is_leaf()) {
      auto value = bc_[node_pos].value();
      if (is_terminal_(node_pos)) {
        value |= (1U << 31);
      }
      kvs.push_back(KvPair{prefix, value});
      return;
    }

    auto base = bc_[node_pos].base();
    auto child_pos = base ^static_cast<uint8_t>('\0');
    if (bc_[child_pos].check() == node_pos) {
      enumerate_prefix(child_pos, prefix, kvs);
    }

    for (uint32_t label = 1; label < 256; ++label) {
      child_pos = base ^ label;
      if (bc_[child_pos].check() == node_pos) {
        enumerate_prefix(child_pos, prefix + static_cast<char>(label), kvs);
      }
    }
  }